

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void io::write_world_to_rom(World *world,ROM *rom)

{
  undefined1 local_48 [8];
  map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  map_layout_addresses;
  ROM *rom_local;
  World *world_local;
  
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  World::clean_unused_map_palettes(world);
  World::clean_unused_blocksets(world);
  World::clean_unused_layouts(world);
  write_map_layouts((map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                     *)local_48,world,
                    (ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  write_blocksets(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count
                 );
  write_item_names(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
  write_items(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  write_chest_contents
            (world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  write_entity_types(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
  write_entity_type_palettes
            (world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  write_game_strings(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
  write_map_connections
            (world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  write_map_palettes(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
  write_maps(world,(ROM *)map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
              *)local_48);
  std::
  map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  ::~map((map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
          *)local_48);
  return;
}

Assistant:

void io::write_world_to_rom(World& world, md::ROM& rom)
{
    world.clean_unused_map_palettes();
    world.clean_unused_blocksets();
    world.clean_unused_layouts();

    std::map<MapLayout*, uint32_t> map_layout_addresses = write_map_layouts(world, rom);
    write_blocksets(world, rom);
    write_item_names(world, rom);
    write_items(world, rom);
    write_chest_contents(world, rom);
    write_entity_types(world, rom);
    write_entity_type_palettes(world, rom);
    write_game_strings(world, rom);
    write_map_connections(world, rom);
    write_map_palettes(world, rom);
    write_maps(world, rom, map_layout_addresses);
}